

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

int rnndec_varaddvalue(rnndeccontext *ctx,char *varset,uint64_t value)

{
  int iVar1;
  int iVar2;
  rnnenum *prVar3;
  rnndecvariant *prVar4;
  rnndecvariant **pprVar5;
  long lVar6;
  
  prVar3 = rnn_findenum(ctx->db,varset);
  if (prVar3 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    if (0 < (long)prVar3->valsnum) {
      lVar6 = 0;
      do {
        if ((prVar3->vals[lVar6]->valvalid != 0) && (prVar3->vals[lVar6]->value == value)) {
          prVar4 = (rnndecvariant *)calloc(0x10,1);
          prVar4->en = prVar3;
          prVar4->variant = (int)lVar6;
          iVar1 = ctx->varsmax;
          if (iVar1 <= ctx->varsnum) {
            iVar2 = 0x10;
            if (iVar1 != 0) {
              iVar2 = iVar1 * 2;
            }
            ctx->varsmax = iVar2;
            pprVar5 = (rnndecvariant **)realloc(ctx->vars,(long)iVar2 << 3);
            ctx->vars = pprVar5;
          }
          iVar1 = ctx->varsnum;
          ctx->varsnum = iVar1 + 1;
          ctx->vars[iVar1] = prVar4;
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (prVar3->valsnum != lVar6);
    }
    fprintf(_stderr,"Value %lx doesn\'t exist in enum %s!\n",value,varset);
  }
  return 0;
}

Assistant:

int rnndec_varaddvalue(struct rnndeccontext *ctx, char *varset, uint64_t value)
{
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (en->vals[i]->valvalid && en->vals[i]->value == value) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}

	fprintf (stderr, "Value %"PRIx64" doesn't exist in enum %s!\n", value, varset);
	return 0;
}